

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

char * metacall_inspect(size_t *size,void *allocator)

{
  value v;
  serial s;
  char *pcVar1;
  
  v = loader_metadata();
  if ((v == (value)0x0) && (v = value_create_map((value *)0x0,0), v == (value)0x0)) {
    log_write_impl_va("metacall",0x8f9,"metacall_inspect",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Invalid MetaCall inspect map creation");
    return (char *)0x0;
  }
  s = serial_create("rapid_json");
  pcVar1 = serial_serialize(s,v,size,(memory_allocator)allocator);
  value_type_destroy(v);
  return pcVar1;
}

Assistant:

char *metacall_inspect(size_t *size, void *allocator)
{
	serial s;

	value v = loader_metadata();

	char *str;

	if (v == NULL)
	{
		v = value_create_map(NULL, 0);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid MetaCall inspect map creation");

			return NULL;
		}
	}

	s = serial_create(metacall_serial());

	str = serial_serialize(s, v, size, allocator);

	value_type_destroy(v);

	return str;
}